

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O1

bool __thiscall
linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::iterator
::operator!=(iterator *this,iterator *other)

{
  bool bVar1;
  bool bVar2;
  vector<int,_std::allocator<int>_> local_58;
  int *local_40;
  int *piStack_38;
  byte local_30;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_58,&(other->source).source);
  local_40 = (other->source).current._M_current;
  piStack_38 = (other->source).end._M_current;
  bVar1 = other->valid;
  bVar2 = this->valid;
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    local_30 = bVar1;
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (bool)((bVar2 | bVar1) & 1);
}

Assistant:

bool operator==(iterator other) const { return !valid && !other.valid; }